

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall Interpreter::execute(Interpreter *this,bool showExecutionTime)

{
  bool bVar1;
  element_type *ident;
  ThrowPacket *this_00;
  element_type *peVar2;
  ostream *poVar3;
  rep rVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e8;
  duration<long,_std::ratio<1L,_1000000L>_> local_e0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> duration;
  time_point stop;
  ReturnPacket *returnPacket;
  undefined1 auStack_b8 [8];
  ValueList initial;
  time_point start;
  string local_90;
  ptr<Value> local_70 [2];
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ptr<Function> main;
  bool showExecutionTime_local;
  Interpreter *this_local;
  
  main.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       showExecutionTime;
  ident = std::__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"main",&local_49);
  Object::getFunction((Object *)local_28,(Identifier *)ident);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (!bVar1) {
    start.__d.__r._6_1_ = 1;
    this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"No function named \'main\' is defined",
               (allocator<char> *)((long)&start.__d.__r + 7));
    ExceptionObjects::undefined((ExceptionObjects *)local_70,&local_90);
    ThrowPacket::ThrowPacket(this_00,local_70);
    start.__d.__r._6_1_ = 0;
    __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  initial.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now()
  ;
  auStack_b8 = (undefined1  [8])0x0;
  initial.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  initial.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::vector
            ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)auStack_b8)
  ;
  peVar2 = std::__shared_ptr_access<Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Function,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  (*(peVar2->super_Value).super_Member._vptr_Member[9])
            (&returnPacket,peVar2,
             (vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)auStack_b8)
  ;
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&returnPacket);
  std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector
            ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)auStack_b8)
  ;
  if ((main.super___shared_ptr<Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1) !=
      0) {
    duration.__r = std::chrono::_V2::system_clock::now();
    local_e8.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&duration,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&initial.
                                       super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_e0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_e8);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Executed in ");
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_e0);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
    poVar3 = std::operator<<(poVar3," ms");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::shared_ptr<Function>::~shared_ptr((shared_ptr<Function> *)local_28);
  return;
}

Assistant:

void Interpreter::execute(bool showExecutionTime) {
    ptr<Function> main = object -> getFunction("main");

    if(!main)
        throw ThrowPacket(ExceptionObjects::undefined("No function named 'main' is defined"));

    auto start = std::chrono::high_resolution_clock::now();

    try {
        ValueList initial = {};
        main -> call(initial);
    } catch(ReturnPacket& returnPacket) {}

    if(showExecutionTime) {
        auto stop = std::chrono::high_resolution_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start);
        std::cout << std::endl << "Executed in " << duration.count() << " ms" << std::endl;
    }
}